

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void learn(bfgs *b,base_learner *base,example *ec)

{
  vw *all_00;
  vw *all;
  float fVar1;
  
  if (b->current_pass <= b->final_pass) {
    all_00 = b->all;
    fVar1 = (ec->l).simple.label;
    if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
      process_example(all_00,b,ec);
      return;
    }
    fVar1 = GD::inline_predict(all_00,ec);
    ec->partial_prediction = fVar1;
    fVar1 = GD::finalize_prediction(all_00->sd,fVar1);
    (ec->pred).scalar = fVar1;
  }
  return;
}

Assistant:

void learn(bfgs& b, base_learner& base, example& ec)
{
  vw* all = b.all;
  assert(ec.in_use);

  if (b.current_pass <= b.final_pass)
  {
    if (test_example(ec))
      predict(b, base, ec);
    else
      process_example(*all, b, ec);
  }
}